

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O1

ion_bpp_err_t assignBuf(ion_bpp_handle_t handle,ion_bpp_address_t adr,ion_bpp_buffer_t **b)

{
  ion_bpp_buffer_tag *piVar1;
  ion_bpp_buffer_tag *piVar2;
  ion_bpp_err_t iVar3;
  ion_bpp_buffer_t *buf;
  
  if (adr == 0) {
    buf = (ion_bpp_buffer_t *)((long)handle + 0x20);
  }
  else {
    piVar1 = (ion_bpp_buffer_tag *)((long)handle + 0x48);
    for (buf = *(ion_bpp_buffer_t **)((long)handle + 0x48);
        (buf->next != piVar1 && ((buf->valid == boolean_false || (buf->adr != adr))));
        buf = buf->next) {
    }
    if (buf->valid == boolean_false) {
      buf->adr = adr;
    }
    else if (buf->adr != adr) {
      if ((buf->modified != boolean_false) && (iVar3 = flush(handle,buf), iVar3 != bErrOk)) {
        return iVar3;
      }
      buf->adr = adr;
      buf->valid = boolean_false;
    }
    piVar2 = buf->next;
    piVar2->prev = buf->prev;
    buf->prev->next = piVar2;
    piVar2 = piVar1->next;
    buf->next = piVar2;
    buf->prev = piVar1;
    piVar2->prev = buf;
    buf->prev->next = buf;
  }
  *b = buf;
  return bErrOk;
}

Assistant:

static ion_bpp_err_t
assignBuf(
	ion_bpp_handle_t	handle,
	ion_bpp_address_t	adr,
	ion_bpp_buffer_t	**b
) {
	ion_bpp_h_node_t *h = handle;
	/* assign buf to adr */
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_err_t		rc;			/* return code */

	if (adr == 0) {
		*b = &h->root;
		return bErrOk;
	}

	/* search for buf with matching adr */
	buf = h->bufList.next;

	while (buf->next != &h->bufList) {
		if (buf->valid && (buf->adr == adr)) {
			break;
		}

		buf = buf->next;
	}

	/* either buf points to a match, or it's last one in list (LRR) */
	if (buf->valid) {
		if (buf->adr != adr) {
			if (buf->modified) {
				if ((rc = flush(handle, buf)) != 0) {
					return rc;
				}
			}

			buf->adr	= adr;
			buf->valid	= boolean_false;
		}
	}
	else {
		buf->adr = adr;
	}

	/* remove from current position and place at front of list */
	buf->next->prev = buf->prev;
	buf->prev->next = buf->next;
	buf->next		= h->bufList.next;
	buf->prev		= &h->bufList;
	buf->next->prev = buf;
	buf->prev->next = buf;
	*b				= buf;
	return bErrOk;
}